

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O1

BOOL __thiscall Js::HeapArgumentsObject::SetItemAt(HeapArgumentsObject *this,uint32 index,Var value)

{
  BOOL BVar1;
  
  BVar1 = HasItemAt(this,index);
  if (BVar1 != 0) {
    DynamicObject::SetSlot(&((this->frameObject).ptr)->super_DynamicObject,-1,false,index,value);
  }
  return (uint)(BVar1 != 0);
}

Assistant:

BOOL HeapArgumentsObject::SetItemAt(uint32 index, Var value)
    {
        // If this arg index is bound to a named formal argument, set it in the local frame.
        // If not, report this fact to the caller, which will defer to the normal set-value-by-index means.
        if (HasItemAt(index))
        {
            this->frameObject->SetSlot(SetSlotArguments(Constants::NoProperty, index, value));
            return true;
        }

        return false;
    }